

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

ALLEGRO_PATH * al_create_path(char *str)

{
  _Bool _Var1;
  int end_pos;
  ALLEGRO_PATH *path;
  ALLEGRO_USTR *pAVar2;
  ALLEGRO_USTR *us2;
  ALLEGRO_USTR *us2_00;
  ALLEGRO_USTR *us1;
  char *pcVar3;
  size_t sVar4;
  int start_pos;
  ALLEGRO_USTR_INFO local_50;
  ALLEGRO_USTR_INFO dot_info;
  
  path = (ALLEGRO_PATH *)
         al_malloc_with_context
                   (0x40,0xa0,
                    "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/path.c"
                    ,"al_create_path");
  if (path == (ALLEGRO_PATH *)0x0) {
    return (ALLEGRO_PATH *)0x0;
  }
  pAVar2 = al_ustr_new("");
  path->drive = pAVar2;
  pAVar2 = al_ustr_new("");
  path->filename = pAVar2;
  _al_vector_init(&path->segments,8);
  pAVar2 = al_ustr_new("");
  path->basename = pAVar2;
  pAVar2 = al_ustr_new("");
  path->full_string = pAVar2;
  if (str != (char *)0x0) {
    pAVar2 = al_ustr_new(str);
    start_pos = 0;
    al_ustr_find_replace_cstr(pAVar2,0,"\\","/");
    us2 = al_ref_cstr(&dot_info,".");
    us2_00 = al_ref_cstr(&local_50,"..");
    us1 = al_ustr_new("");
    while (end_pos = al_ustr_find_chr(pAVar2,start_pos,0x2f), end_pos != -1) {
      al_ustr_assign_substr(us1,pAVar2,start_pos,end_pos);
      pcVar3 = al_cstr(us1);
      al_append_path_component(path,pcVar3);
      start_pos = end_pos + 1;
    }
    sVar4 = al_ustr_size(pAVar2);
    al_ustr_assign_substr(us1,pAVar2,start_pos,(int)sVar4);
    _Var1 = al_ustr_equal(us1,us2);
    if ((_Var1) || (_Var1 = al_ustr_equal(us1,us2_00), _Var1)) {
      pcVar3 = al_cstr(us1);
      al_append_path_component(path,pcVar3);
    }
    else {
      al_ustr_assign(path->filename,us1);
    }
    al_ustr_free(us1);
    al_ustr_free(pAVar2);
    return path;
  }
  return path;
}

Assistant:

ALLEGRO_PATH *al_create_path(const char *str)
{
   ALLEGRO_PATH *path;

   path = al_malloc(sizeof(ALLEGRO_PATH));
   if (!path)
      return NULL;

   path->drive = al_ustr_new("");
   path->filename = al_ustr_new("");
   _al_vector_init(&path->segments, sizeof(ALLEGRO_USTR *));
   path->basename = al_ustr_new("");
   path->full_string = al_ustr_new("");

   if (str != NULL) {
      ALLEGRO_USTR *copy = al_ustr_new(str);
      replace_backslashes(copy);

      if (!parse_path_string(copy, path)) {
         al_destroy_path(path);
         path = NULL;
      }

      al_ustr_free(copy);
   }

   return path;
}